

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O3

void test_2d_static<0ul,0ul,1ul,1ul>(void)

{
  int dptr [1];
  size_t true_idx;
  int local_4c;
  int *local_48;
  unsigned_long local_40;
  int *local_38;
  
  local_40 = CONCAT71(local_40._1_7_,1);
  local_48 = (int *)CONCAT71(local_48._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",(bool *)&local_40,
             (bool *)&local_48);
  local_40 = 1;
  local_48._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_40,
             (int *)&local_48);
  local_40 = 1;
  local_48 = (int *)CONCAT44(local_48._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_40,
             (int *)&local_48);
  local_40 = 1;
  local_48 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_40,
             (unsigned_long *)&local_48);
  local_40 = 1;
  local_48 = (int *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_40,
             (unsigned_long *)&local_48);
  local_40 = 0;
  local_48 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.index(i, j))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x2d,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
             (unsigned_long *)&local_48,&local_40);
  local_38 = &local_4c + local_40;
  local_48 = &local_4c;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x2f,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_48,&local_38)
  ;
  local_4c = 0x2a;
  local_48 = (int *)CONCAT44(local_48._4_4_,0x2a);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index(i, j)])","42",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x33,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_4c,
             (int *)&local_48);
  local_40 = 0;
  local_48 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.index(i, j))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x3c,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
             (unsigned_long *)&local_48,&local_40);
  local_38 = &local_4c + local_40;
  local_48 = &local_4c;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x3e,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_48,&local_38)
  ;
  local_40 = 0;
  local_48 = (int *)0x0;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.index(i, j))","true_idx",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x57,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",
             (unsigned_long *)&local_48,&local_40);
  local_38 = &local_4c + local_40;
  local_48 = &local_4c;
  boost::detail::test_eq_impl<int*,int*>
            ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x59,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_48,&local_38)
  ;
  local_48 = (int *)CONCAT44(local_48._4_4_,0x2a);
  boost::detail::test_eq_impl<int,int>
            ("(dptr[l.index(i, j)])","42",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x6a,"void test_2d_static() [N = 0UL, M = 0UL, X = 1UL, Y = 1UL]",&local_4c,
             (int *)&local_48);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}